

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void exp_repeat_pop(lyxp_expr *exp,uint16_t exp_idx)

{
  uint8_t *puVar1;
  ushort uVar2;
  LY_ERR *pLVar3;
  ushort uVar4;
  undefined6 in_register_00000032;
  
  puVar1 = exp->repeat[CONCAT62(in_register_00000032,exp_idx) & 0xffffffff];
  if (puVar1 != (uint8_t *)0x0) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      uVar2 = uVar4 + 1;
    } while (puVar1[(ulong)uVar4 + 1] != '\0');
    puVar1[uVar4] = '\0';
    return;
  }
  pLVar3 = ly_errno_location();
  *pLVar3 = LY_EINT;
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",0x636
        );
  return;
}

Assistant:

static void
exp_repeat_pop(struct lyxp_expr *exp, uint16_t exp_idx)
{
    uint16_t i;

    if (!exp->repeat[exp_idx]) {
        LOGINT;
        return;
    }

    for (i = 0; exp->repeat[exp_idx][i + 1]; ++i);

    exp->repeat[exp_idx][i] = 0;
}